

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

size_t format_size(void *context,char *time,uint64_t id,size_t line,char *func,char *file,
                  char *level,char *message,metacall_log_custom_va_list args)

{
  int iVar1;
  size_t sVar2;
  va_list va;
  
  if (args == (metacall_log_custom_va_list)0x0) {
    sVar2 = strlen(message);
  }
  else {
    va[0].reg_save_area = args->va[0].reg_save_area;
    va[0].gp_offset = args->va[0].gp_offset;
    va[0].fp_offset = args->va[0].fp_offset;
    va[0].overflow_arg_area = args->va[0].overflow_arg_area;
    iVar1 = vsnprintf((char *)0x0,0,message,va);
    sVar2 = (size_t)iVar1;
  }
  iVar1 = snprintf((char *)0x0,0,"%.19s #%d %s:%d %s @%s ",time,id & 0xffffffff,file,line,func,level
                  );
  return (long)iVar1 + sVar2 + 1;
}

Assistant:

static size_t format_size(void *context, const char *time, uint64_t id, size_t line, const char *func, const char *file, const char *level, const char *message, metacall_log_custom_va_list args)
{
	size_t length = 0;

	(void)context;

	if (args != NULL)
	{
		va_list va;

		va_copy(va, args->va);

		length = vsnprintf(NULL, 0, message, va);

		va_end(va);
	}
	else
	{
		length = strlen(message);
	}

	return snprintf(NULL, 0, format, time, (int)id, file, (int)line, func, level) + length + 1;
}